

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O3

int ompt_get_place_proc_ids(int place_num,int ids_size,int *ids)

{
  _func_int *p_Var1;
  code *pcVar2;
  long lVar3;
  int *__dest;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  ulong uVar9;
  uint uVar10;
  undefined8 uStack_50;
  uint auStack_48 [2];
  int *local_40;
  int local_34;
  long *plVar8;
  
  lVar3 = -((ulong)(uint)ids_size * 4 + 0xf & 0xfffffffffffffff0);
  uVar7 = 0;
  uVar10 = 0;
  if (((__kmp_affin_mask_size != 0) && (uVar10 = uVar7, -1 < place_num)) &&
     (place_num < (int)__kmp_affinity_num_masks)) {
    p_Var1 = __kmp_affinity_dispatch->_vptr_KMPAffinity[8];
    local_34 = ids_size;
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x17689f;
    iVar5 = (*p_Var1)(__kmp_affinity_dispatch,__kmp_affinity_masks);
    plVar8 = (long *)CONCAT44(extraout_var,iVar5);
    pcVar2 = *(code **)(*plVar8 + 0x50);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1768ab;
    uVar6 = (*pcVar2)(plVar8);
    pcVar2 = *(code **)(*plVar8 + 0x58);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1768b7;
    uVar7 = (*pcVar2)(plVar8);
    if (uVar6 != uVar7) {
      uVar10 = 0;
      local_40 = ids;
      do {
        uVar9 = (ulong)uVar6;
        p_Var1 = __kmp_affin_fullMask->_vptr_Mask[3];
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1768d5;
        iVar5 = (*p_Var1)(__kmp_affin_fullMask,uVar9);
        if ((char)iVar5 != '\0') {
          pcVar2 = *(code **)(*plVar8 + 0x18);
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1768e5;
          cVar4 = (*pcVar2)(plVar8,uVar9);
          if (cVar4 != '\0') {
            if ((int)uVar10 < local_34) {
              *(uint *)((long)auStack_48 + lVar3 + (long)(int)uVar10 * 4) = uVar6;
            }
            uVar10 = uVar10 + 1;
          }
        }
        pcVar2 = *(code **)(*plVar8 + 0x60);
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x176905;
        uVar6 = (*pcVar2)(plVar8,uVar9);
        pcVar2 = *(code **)(*plVar8 + 0x58);
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x176911;
        uVar7 = (*pcVar2)(plVar8);
        __dest = local_40;
      } while (uVar6 != uVar7);
      if (0 < (int)uVar10 && (int)uVar10 <= local_34) {
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x176939;
        memcpy(__dest,(void *)((long)auStack_48 + lVar3),(ulong)uVar10 << 2);
      }
    }
  }
  return uVar10;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_place_proc_ids(int place_num, int ids_size,
                                             int *ids) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  int i, count;
  int tmp_ids[ids_size];
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  if (place_num < 0 || place_num >= (int)__kmp_affinity_num_masks)
    return 0;
  /* TODO: Is this safe for asynchronous call from signal handler during runtime
   * shutdown? */
  kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
  count = 0;
  KMP_CPU_SET_ITERATE(i, mask) {
    if ((!KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
        (!KMP_CPU_ISSET(i, mask))) {
      continue;
    }
    if (count < ids_size)
      tmp_ids[count] = i;
    count++;
  }
  if (ids_size >= count) {
    for (i = 0; i < count; i++) {
      ids[i] = tmp_ids[i];
    }
  }
  return count;
#endif
}